

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_aux_mesh.cxx
# Opt level: O3

void __thiscall
level_aux_mesh::compact_vertices<xray_re::hom_poly>
          (level_aux_mesh *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *refs,
          hom_poly *faces)

{
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *this_00;
  pointer *pp_Var1;
  float fVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  uint *puVar3;
  iterator __position;
  pointer pbVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint32_t uVar9;
  uint *puVar10;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var11;
  anon_union_12_2_77b31271_for__vector3<float>_1 local_40;
  
  __first._M_current =
       (refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  _Var11._M_current = __first._M_current;
  if (__first._M_current != __last._M_current) {
    uVar6 = (long)__last._M_current - (long)__first._M_current >> 2;
    lVar5 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<vertex_less<xray_re::hom_poly>>>
              (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<vertex_less<xray_re::hom_poly>_>)faces);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<vertex_less<xray_re::hom_poly>>>
              (__first,__last,(_Iter_comp_iter<vertex_less<xray_re::hom_poly>_>)faces);
    __first._M_current =
         (refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    _Var11._M_current =
         (refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start;
  }
  this_00 = &(this->super_xr_mesh_builder).super_xr_mesh.m_points;
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::reserve
            (this_00,(long)__first._M_current - (long)_Var11._M_current >> 2);
  puVar10 = (refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (refs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar10 != puVar3) {
    uVar9 = (int)((ulong)((long)(this->super_xr_mesh_builder).super_xr_mesh.m_points.
                                super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_xr_mesh_builder).super_xr_mesh.m_points.
                               super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    do {
      (this->super_xr_mesh_builder).m_faces.
      super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
      ._M_impl.super__Vector_impl_data._M_start[*puVar10 >> 2].field_0.__refs[*puVar10 & 3] = uVar9;
      uVar7 = *puVar10 >> 2;
      uVar6 = (ulong)(*puVar10 & 3);
      local_40._0_8_ = *(undefined8 *)((long)&faces[uVar7].field_0 + uVar6 * 0xc);
      local_40.field_0.z = *(float *)((long)&faces[uVar7].field_0 + uVar6 * 0xc + 8);
      __position._M_current =
           (this->super_xr_mesh_builder).super_xr_mesh.m_points.
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_xr_mesh_builder).super_xr_mesh.m_points.
          super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>::
        _M_realloc_insert<xray_re::_vector3<float>const&>
                  ((vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *)
                   this_00,__position,(_vector3<float> *)&local_40.field_0);
      }
      else {
        ((__position._M_current)->field_0).field_0.z = local_40.field_0.z;
        *(undefined8 *)&(__position._M_current)->field_0 = local_40._0_8_;
        pp_Var1 = &(this->super_xr_mesh_builder).super_xr_mesh.m_points.
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
      puVar10 = puVar10 + 1;
      if (puVar10 != puVar3) {
        pbVar4 = (this->super_xr_mesh_builder).m_faces.
                 super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while( true ) {
          uVar7 = *puVar10;
          uVar8 = uVar7 >> 2;
          fVar2 = *(float *)((long)&faces[uVar8].field_0 + (ulong)(uVar7 & 3) * 0xc);
          if ((fVar2 != local_40.field_0.x) || (NAN(fVar2) || NAN(local_40.field_0.x))) break;
          lVar5 = (ulong)(uVar7 & 3) * 0xc;
          fVar2 = *(float *)((long)&faces[uVar8].field_0 + lVar5 + 4);
          if ((fVar2 != local_40.field_0.y) ||
             (((NAN(fVar2) || NAN(local_40.field_0.y) ||
               (fVar2 = *(float *)((long)&faces[uVar8].field_0 + lVar5 + 8),
               fVar2 != local_40.field_0.z)) || (NAN(fVar2) || NAN(local_40.field_0.z))))) break;
          pbVar4[uVar7 >> 2].field_0.__refs[uVar7 & 3] = uVar9;
          puVar10 = puVar10 + 1;
          if (puVar10 == puVar3) break;
        }
      }
      uVar9 = uVar9 + 1;
    } while (puVar10 != puVar3);
  }
  return;
}

Assistant:

void level_aux_mesh::compact_vertices(std::vector<uint32_t>& refs, const T* faces)
{
	std::sort(refs.begin(), refs.end(), vertex_less<T>(faces));
	m_points.reserve(refs.size());
	fvector3 p;
	uint32_t point_idx = uint32_t(m_points.size() & UINT32_MAX);
	for (std::vector<uint32_t>::iterator it = refs.begin(), end = refs.end(); it != end; ++point_idx) {
		vertex_point(*it) = point_idx;
		m_points.push_back(p.set(face_vertex<T>(faces, *it)));
		while(++it != end && face_vertex<T>(faces, *it) == p)
			vertex_point(*it) = point_idx;
	}
}